

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCube::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCube *this,int level,int layer)

{
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&__return_storage_ptr__->super_ConstPixelBufferAccess,
             (ConstPixelBufferAccess *)
             ((long)level * 0x28 +
             (long)(this->m_texture).m_access[(uint)(&tcuFaceMapping)[layer]].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start));
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCube::getLevel (int level, int layer)
{
	return m_texture.getLevelFace(level, tcuFaceMapping[layer]);
}